

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_whois(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  __type_conflict2 _Var2;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  bool bVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  CClass *pCVar8;
  char *args_15;
  char *args_14;
  char *args_13;
  char *args_12;
  char *args_11;
  char *args_10;
  char **args_1;
  long in_RDI;
  char disp [4608];
  char rbuf [4608];
  CHAR_DATA *wch;
  char *imm_lvl;
  char *class_name;
  DESCRIPTOR_DATA *d;
  bool found;
  BUFFER *output;
  string buffer;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffc278;
  CHAR_DATA *in_stack_ffffffffffffc280;
  CHAR_DATA *in_stack_ffffffffffffc288;
  CHAR_DATA *in_stack_ffffffffffffc290;
  CHAR_DATA *in_stack_ffffffffffffc298;
  char **in_stack_ffffffffffffc2a0;
  char **in_stack_ffffffffffffc2a8;
  char **in_stack_ffffffffffffc2b8;
  char **local_3d00;
  char **local_3cf8;
  char **local_3ce8;
  CHAR_DATA *local_3ca0;
  CHAR_DATA *local_3c60;
  CHAR_DATA *local_3c58;
  CHAR_DATA *local_3c48;
  DESCRIPTOR_DATA *local_3c30;
  char **local_3bf0;
  char **local_3be8;
  PC_DATA *local_3bd8;
  CHAR_DATA *local_3b60;
  undefined7 in_stack_ffffffffffffc4e0;
  undefined1 in_stack_ffffffffffffc4e7;
  uint in_stack_ffffffffffffc4ec;
  uint uVar9;
  undefined4 in_stack_ffffffffffffc4f0;
  undefined1 in_stack_ffffffffffffc4f4;
  CHAR_DATA *pCVar10;
  char **in_stack_ffffffffffffc518;
  char **in_stack_ffffffffffffc520;
  char *in_stack_ffffffffffffc528;
  char *in_stack_ffffffffffffc530;
  char *in_stack_ffffffffffffc538;
  CHAR_DATA *local_3ac0;
  CHAR_DATA *local_3ab8;
  CHAR_DATA *local_3ab0;
  CHAR_DATA *local_3aa8;
  CHAR_DATA *local_3aa0;
  CHAR_DATA *local_3a98;
  CHAR_DATA *local_3a90;
  string local_3a88 [32];
  CHAR_DATA *local_3a68;
  CHAR_DATA *local_3a60;
  DESCRIPTOR_DATA *local_3a58;
  DESCRIPTOR_DATA *local_3a50;
  DESCRIPTOR_DATA *local_3a48;
  DESCRIPTOR_DATA *in_stack_ffffffffffffc5c0;
  OBJ_DATA *in_stack_ffffffffffffc5c8;
  ROOM_INDEX_DATA *in_stack_ffffffffffffc5d0;
  ROOM_INDEX_DATA *in_stack_ffffffffffffc5d8;
  undefined1 local_39e0 [16];
  CHAR_DATA *local_39d0;
  string local_39c8 [32];
  v9 local_39a8 [4608];
  CHAR_DATA local_27a8 [5];
  CHAR_DATA *local_15a0;
  char *local_1598;
  char *local_1590;
  DESCRIPTOR_DATA *local_1588;
  byte local_157d;
  BUFFER *local_1570;
  string local_1568 [32];
  char local_1548;
  long local_340;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_char_*,_const_char_*,_const_char_*>
  local_338;
  undefined8 local_2e8;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_2e0;
  DESCRIPTOR_DATA *local_2d8;
  DESCRIPTOR_DATA *local_2d0;
  CHAR_DATA **local_2c8;
  CHAR_DATA **local_2c0;
  char **local_2b8;
  char (*local_2b0) [4608];
  v9 *local_2a8;
  DESCRIPTOR_DATA *local_2a0;
  DESCRIPTOR_DATA *pDStack_298;
  undefined1 *local_290;
  char *local_288;
  DESCRIPTOR_DATA **local_280;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char[1],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char_*,_const_char_*,_const_char_*>
  local_278;
  undefined8 local_1a0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char[1],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_198;
  CHAR_DATA *local_190;
  CHAR_DATA *local_188;
  char **local_180;
  char **local_178;
  char **local_170;
  CHAR_DATA *local_168;
  CHAR_DATA *local_160;
  CHAR_DATA *local_158;
  CHAR_DATA *local_150;
  char *local_148;
  CHAR_DATA **local_140;
  CHAR_DATA **local_138;
  CHAR_DATA **local_130;
  char (*local_128) [4608];
  v9 *local_120;
  CHAR_DATA *local_118;
  CHAR_DATA *pCStack_110;
  string *local_108;
  char *local_100;
  CHAR_DATA **local_f8;
  char *local_f0;
  CHAR_DATA **local_e8;
  char *local_e0;
  DESCRIPTOR_DATA **local_d8;
  DESCRIPTOR_DATA **local_d0;
  DESCRIPTOR_DATA *local_c8;
  DESCRIPTOR_DATA *pDStack_c0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_b8;
  undefined8 *local_b0;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_90;
  char *local_88;
  CHAR_DATA **local_80;
  CHAR_DATA *local_78;
  CHAR_DATA *pCStack_70;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char[1],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_60;
  undefined8 *local_58;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char[1],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_50;
  undefined8 local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>,_char[4608],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char[1],_const_char_*,_const_char_*,_const_char_*,_const_char_*,_char_*,_const_char_*,_const_char_*>
  *local_38;
  char *local_30;
  
  local_340 = in_RDI;
  one_argument((char *)in_stack_ffffffffffffc280,(char *)in_stack_ffffffffffffc278);
  if (local_1548 == '\0') {
    send_to_char((char *)in_stack_ffffffffffffc290,in_stack_ffffffffffffc288);
  }
  else {
    std::__cxx11::string::string(local_1568);
    local_1570 = new_buf();
    local_157d = 0;
    local_3cf8 = in_stack_ffffffffffffc518;
    local_3ce8 = in_stack_ffffffffffffc520;
    for (local_1588 = descriptor_list; local_1588 != (DESCRIPTOR_DATA *)0x0;
        local_1588 = local_1588->next) {
      if ((local_1588->connected == 0) &&
         (bVar3 = can_see(in_stack_ffffffffffffc298,in_stack_ffffffffffffc290), bVar3)) {
        if (local_1588->original == (CHAR_DATA *)0x0) {
          pCVar10 = local_1588->character;
        }
        else {
          pCVar10 = local_1588->original;
        }
        local_15a0 = pCVar10;
        uVar4 = can_see(in_stack_ffffffffffffc298,in_stack_ffffffffffffc290);
        if (((bool)uVar4) &&
           (uVar5 = is_affected(local_1588->character,(int)gsn_disguise), !(bool)uVar5)) {
          uVar6 = str_cmp(local_15a0->name,local_15a0->true_name);
          if ((bool)uVar6) {
            in_stack_ffffffffffffc4f4 = is_immortal(in_stack_ffffffffffffc278);
            if ((bool)in_stack_ffffffffffffc4f4) {
              bVar3 = str_prefix((char *)in_stack_ffffffffffffc2a8,(char *)in_stack_ffffffffffffc2a0
                                );
              in_stack_ffffffffffffc4f0 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffc4f0);
              uVar9 = (uint)((bVar3 ^ 0xffU) & 1);
              in_stack_ffffffffffffc4ec = uVar9;
            }
            else {
              uVar9 = 0;
              in_stack_ffffffffffffc4ec = uVar9;
            }
          }
          else {
            in_stack_ffffffffffffc4e7 =
                 str_prefix((char *)in_stack_ffffffffffffc2a8,(char *)in_stack_ffffffffffffc2a0);
            uVar9 = (uint)((in_stack_ffffffffffffc4e7 ^ 0xff) & 1);
          }
          if (uVar9 != 0) {
            local_157d = 1;
            pCVar8 = char_data::Class(in_stack_ffffffffffffc290);
            local_1590 = RString::operator_cast_to_char_(&pCVar8->who_name);
            switch(local_15a0->level) {
            case 0x34:
              local_1590 = "AVA";
              local_1598 = "Avatar ";
              break;
            case 0x35:
              local_1590 = "ANG";
              local_1598 = " Minor ";
              break;
            case 0x36:
              local_1590 = "DEM";
              local_1598 = " Minor ";
              break;
            case 0x37:
              local_1590 = "IMM";
              local_1598 = "Greater";
              break;
            case 0x38:
              local_1590 = "GOD";
              local_1598 = "Greater";
              break;
            case 0x39:
              local_1590 = "DEI";
              local_1598 = "Greater";
              break;
            case 0x3a:
              local_1590 = "SUP";
              local_1598 = " Elder ";
              break;
            case 0x3b:
              local_1590 = "CRE";
              local_1598 = " Elder ";
              break;
            case 0x3c:
              local_1590 = "IMP";
              local_1598 = "Creator";
              break;
            default:
              local_1598 = "";
            }
            bVar3 = is_immortal(in_stack_ffffffffffffc278);
            if ((bVar3) ||
               ((bVar3 = is_heroimm(in_stack_ffffffffffffc278), bVar3 && (local_15a0->level < 0x34))
               )) {
              iVar7 = get_trust(in_stack_ffffffffffffc278);
              if (iVar7 < 0x34) {
                strcpy((char *)local_27a8,"");
              }
              else {
                strcpy((char *)local_27a8,"  ");
              }
              iVar7 = get_trust(in_stack_ffffffffffffc278);
              if ((iVar7 < 0x34) || (local_15a0->pcdata->history_buffer == (char *)0x0)) {
                local_3b60 = local_27a8;
              }
              else {
                local_3b60 = (CHAR_DATA *)0x7c159e;
              }
              local_39d0 = local_3b60;
              bVar3 = can_pk(in_stack_ffffffffffffc288,in_stack_ffffffffffffc280);
              args_15 = "";
              local_39e0._8_8_ = "";
              if (bVar3) {
                local_39e0._8_8_ = "(PK) ";
              }
              local_39e0._0_8_ = "";
              if (0x32 < local_15a0->incog_level) {
                local_39e0._0_8_ = "(Incog) ";
              }
              if (0x32 < local_15a0->invis_level) {
                args_15 = "(Wizi) ";
              }
              in_stack_ffffffffffffc290 = (CHAR_DATA *)&cabal_table[local_15a0->cabal].who_name;
              iVar7 = get_trust(in_stack_ffffffffffffc278);
              bVar3 = false;
              if (0x38 < iVar7) {
                uVar1 = local_15a0->act[0];
                _Var2 = std::pow<int,int>(0,0x54cf59);
                bVar3 = (uVar1 & (long)_Var2) != 0;
              }
              args_14 = "";
              if (bVar3) {
                args_14 = "(MORON) ";
              }
              uVar1 = local_15a0->comm[0];
              _Var2 = std::pow<int,int>(0,0x54cfd5);
              bVar3 = false;
              if ((uVar1 & (long)_Var2) != 0) {
                bVar3 = 0x33 < *(short *)(local_340 + 0x138);
              }
              args_13 = "";
              if (bVar3) {
                args_13 = "[AFK] ";
              }
              uVar1 = local_15a0->act[0];
              _Var2 = std::pow<int,int>(0,0x54d06e);
              args_12 = "";
              if ((uVar1 & (long)_Var2) != 0) {
                args_12 = "(WANTED) ";
              }
              uVar1 = local_15a0->act[0];
              _Var2 = std::pow<int,int>(0,0x54d0d5);
              args_11 = "";
              if ((uVar1 & (long)_Var2) != 0) {
                args_11 = "(THIEF) ";
              }
              bVar3 = isNewbie(local_15a0);
              args_10 = "";
              if (bVar3) {
                args_10 = "(NEWBIE) ";
              }
              bVar3 = is_npc(in_stack_ffffffffffffc278);
              if (bVar3) {
                local_3bd8 = (PC_DATA *)0x7e100f;
              }
              else {
                local_3bd8 = (PC_DATA *)local_15a0->pcdata->title;
              }
              bVar3 = is_npc(in_stack_ffffffffffffc278);
              if (bVar3) {
                local_3be8 = (char **)0x7e100f;
              }
              else {
                if (local_15a0->pcdata->extitle == (char *)0x0) {
                  local_3bf0 = (char **)0x7e100f;
                }
                else {
                  local_3bf0 = (char **)local_15a0->pcdata->extitle;
                }
                local_3be8 = local_3bf0;
              }
              in_stack_ffffffffffffc2b8 = (char **)&stack0xffffffffffffc5f0;
              in_stack_ffffffffffffc2a8 = (char **)&stack0xffffffffffffc600;
              in_stack_ffffffffffffc2a0 = (char **)&stack0xffffffffffffc608;
              in_stack_ffffffffffffc298 = (CHAR_DATA *)&stack0xffffffffffffc610;
              in_stack_ffffffffffffc288 = (CHAR_DATA *)&stack0xffffffffffffc618;
              in_stack_ffffffffffffc280 = (CHAR_DATA *)local_39e0;
              in_stack_ffffffffffffc278 = (CHAR_DATA *)(local_39e0 + 8);
              ::fmt::v9::
              sprintf<char[43],short,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char_const*,char_const*,char_const*,char*,char_const*,char_const*,char>
                        ((char (*) [43])in_stack_ffffffffffffc538,(short *)in_stack_ffffffffffffc530
                         ,(char **)in_stack_ffffffffffffc528,local_3ce8,local_3cf8,
                         (char **)in_stack_ffffffffffffc5c0,(char **)in_stack_ffffffffffffc5c8,
                         (char **)in_stack_ffffffffffffc5d0,(char **)in_stack_ffffffffffffc5d8,
                         local_3be8,(char **)local_3bd8,(char **)args_10,(char **)args_11,
                         (char **)args_12,(char **)args_13,(char **)args_14,(char **)args_15);
              std::__cxx11::string::operator=(local_1568,local_39c8);
              std::__cxx11::string::~string(local_39c8);
              std::__cxx11::string::data();
              add_buf((BUFFER *)in_stack_ffffffffffffc298,(char *)in_stack_ffffffffffffc290);
            }
            else {
              iVar7 = get_trust(in_stack_ffffffffffffc278);
              if ((iVar7 < 0x34) || (bVar3 = is_immortal(in_stack_ffffffffffffc278), bVar3)) {
                if (local_15a0->pcdata->shifted < 0) {
                  bVar3 = is_immortal(in_stack_ffffffffffffc278);
                  if (bVar3) {
                    sprintf((char *)local_39a8,"*   %s  *",local_1598);
                  }
                  else {
                    sprintf((char *)local_39a8,"[%2d %-5s %s]",(ulong)(uint)(int)local_15a0->level,
                            pc_race_table[local_15a0->race].who_name_five,local_1590);
                  }
                  local_f8 = &local_3a98;
                  local_100 = "{} {}{}{}{}{}{}{}{}{}{}{}\n\r";
                  local_f0 = "{} {}{}{}{}{}{}{}{}{}{}{}\n\r";
                  local_3a98 = (CHAR_DATA *)0x7c15bd;
                  local_e8 = local_f8;
                  local_3a90 = (CHAR_DATA *)std::char_traits<char>::length((char_type *)0x54d9c7);
                  local_30 = local_100;
                  bVar3 = can_pk(in_stack_ffffffffffffc288,in_stack_ffffffffffffc280);
                  local_3aa0 = (CHAR_DATA *)0x7e100f;
                  if (bVar3) {
                    local_3aa0 = (CHAR_DATA *)0x7c1562;
                  }
                  local_3aa8 = (CHAR_DATA *)0x7e100f;
                  if (0x32 < local_15a0->incog_level) {
                    local_3aa8 = (CHAR_DATA *)0x7c1568;
                  }
                  local_3ab0 = (CHAR_DATA *)0x7e100f;
                  if (0x32 < local_15a0->invis_level) {
                    local_3ab0 = (CHAR_DATA *)0x7beec2;
                  }
                  if ((local_15a0->cabal == *(short *)(local_340 + 0x132)) ||
                     (bVar3 = is_immortal(in_stack_ffffffffffffc278), bVar3)) {
                    local_3ca0 = (CHAR_DATA *)cabal_table[local_15a0->cabal].who_name;
                  }
                  else {
                    local_3ca0 = (CHAR_DATA *)0x7e100f;
                  }
                  local_3ab8 = local_3ca0;
                  uVar1 = local_15a0->comm[0];
                  _Var2 = std::pow<int,int>(0,0x54db46);
                  local_3ac0 = (CHAR_DATA *)0x7e100f;
                  if ((uVar1 & (long)_Var2) != 0) {
                    local_3ac0 = (CHAR_DATA *)0x7beeb2;
                  }
                  uVar1 = local_15a0->act[0];
                  _Var2 = std::pow<int,int>(0,0x54dbad);
                  in_stack_ffffffffffffc538 = "";
                  if ((uVar1 & (long)_Var2) != 0) {
                    in_stack_ffffffffffffc538 = "(WANTED) ";
                  }
                  uVar1 = local_15a0->act[0];
                  _Var2 = std::pow<int,int>(0,0x54dc14);
                  in_stack_ffffffffffffc530 = "";
                  if ((uVar1 & (long)_Var2) != 0) {
                    in_stack_ffffffffffffc530 = "(THIEF) ";
                  }
                  bVar3 = isNewbie(local_15a0);
                  in_stack_ffffffffffffc528 = "";
                  if (bVar3) {
                    in_stack_ffffffffffffc528 = "(NEWBIE) ";
                  }
                  in_stack_ffffffffffffc2a0 = &local_15a0->name;
                  bVar3 = is_npc(in_stack_ffffffffffffc278);
                  if (bVar3) {
                    local_3ce8 = (char **)0x7e100f;
                  }
                  else {
                    local_3ce8 = (char **)local_15a0->pcdata->title;
                  }
                  bVar3 = is_npc(in_stack_ffffffffffffc278);
                  if (bVar3) {
                    local_3cf8 = (char **)0x7e100f;
                  }
                  else {
                    if (local_15a0->pcdata->extitle == (char *)0x0) {
                      local_3d00 = (char **)0x7e100f;
                    }
                    else {
                      local_3d00 = (char **)local_15a0->pcdata->extitle;
                    }
                    local_3cf8 = local_3d00;
                  }
                  local_108 = local_3a88;
                  local_118 = local_3a98;
                  pCStack_110 = local_3a90;
                  local_120 = local_39a8;
                  local_128 = (char (*) [4608])&local_3aa0;
                  local_130 = &local_3aa8;
                  local_138 = &local_3ab0;
                  local_140 = &local_3ab8;
                  local_148 = "";
                  in_stack_ffffffffffffc280 = (CHAR_DATA *)&local_3ac0;
                  in_stack_ffffffffffffc288 = (CHAR_DATA *)&stack0xffffffffffffc538;
                  in_stack_ffffffffffffc290 = (CHAR_DATA *)&stack0xffffffffffffc530;
                  in_stack_ffffffffffffc298 = (CHAR_DATA *)&stack0xffffffffffffc528;
                  in_stack_ffffffffffffc2a8 = (char **)&stack0xffffffffffffc520;
                  local_180 = (char **)&stack0xffffffffffffc518;
                  local_80 = &local_118;
                  local_190 = local_3a98;
                  local_188 = local_3a90;
                  in_stack_ffffffffffffc278 = (CHAR_DATA *)0x7e100f;
                  local_178 = in_stack_ffffffffffffc2a8;
                  local_170 = in_stack_ffffffffffffc2a0;
                  local_168 = in_stack_ffffffffffffc298;
                  local_160 = in_stack_ffffffffffffc290;
                  local_158 = in_stack_ffffffffffffc288;
                  local_150 = in_stack_ffffffffffffc280;
                  local_78 = local_190;
                  pCStack_70 = local_188;
                  ::fmt::v9::
                  make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char_const*&,char_const*&,char_const*&,char_const*&,char_const(&)[1],char_const*&,char_const*&,char_const*&,char_const*&,char*&,char_const*&,char_const*&>
                            (&local_278,local_120,local_128,(char **)local_130,(char **)local_138,
                             (char **)local_140,(char **)0x7e100f,
                             (char (*) [1])in_stack_ffffffffffffc280,
                             (char **)in_stack_ffffffffffffc288,(char **)in_stack_ffffffffffffc290,
                             (char **)in_stack_ffffffffffffc298,in_stack_ffffffffffffc2a0,
                             in_stack_ffffffffffffc2a8,local_180,in_stack_ffffffffffffc2b8);
                  local_58 = &local_1a0;
                  local_60 = &local_278;
                  local_48 = 0xccccccccccccc;
                  local_1a0 = 0xccccccccccccc;
                  fmt_00.data_._4_1_ = in_stack_ffffffffffffc4f4;
                  fmt_00.data_._0_4_ = in_stack_ffffffffffffc4f0;
                  fmt_00.data_._5_1_ = uVar6;
                  fmt_00.data_._6_1_ = uVar5;
                  fmt_00.data_._7_1_ = uVar4;
                  fmt_00.size_ = (size_t)pCVar10;
                  args_00.desc_._7_1_ = in_stack_ffffffffffffc4e7;
                  args_00.desc_._0_7_ = in_stack_ffffffffffffc4e0;
                  args_00.field_1._0_4_ = uVar9;
                  args_00.field_1._4_4_ = in_stack_ffffffffffffc4ec;
                  local_50 = local_60;
                  local_40 = local_58;
                  local_38 = local_60;
                  local_198 = local_60;
                  ::fmt::v9::vformat_abi_cxx11_(fmt_00,args_00);
                  std::__cxx11::string::operator=(local_1568,local_3a88);
                  std::__cxx11::string::~string(local_3a88);
                  std::__cxx11::string::data();
                  add_buf((BUFFER *)in_stack_ffffffffffffc298,(char *)in_stack_ffffffffffffc290);
                }
              }
              else if (local_15a0->pcdata->shifted < 0) {
                bVar3 = is_immortal(in_stack_ffffffffffffc278);
                if (bVar3) {
                  sprintf((char *)local_39a8,"*   %s  *",local_1598);
                }
                else {
                  sprintf((char *)local_39a8,"[%2d %-5s %s]",(ulong)(uint)(int)local_15a0->level,
                          pc_race_table[local_15a0->race].who_name_five,local_1590);
                }
                local_280 = &local_3a50;
                local_288 = "{} {}{}{}{}\n\r";
                local_e0 = "{} {}{}{}{}\n\r";
                local_3a50 = (DESCRIPTOR_DATA *)0x7c15af;
                local_d8 = local_280;
                local_3a48 = (DESCRIPTOR_DATA *)
                             std::char_traits<char>::length((char_type *)0x54d4f9);
                local_88 = local_288;
                if (local_15a0->cabal == *(short *)(local_340 + 0x132)) {
                  local_3c30 = (DESCRIPTOR_DATA *)cabal_table[local_15a0->cabal].who_name;
                }
                else {
                  local_3c30 = (DESCRIPTOR_DATA *)0x7e100f;
                }
                local_3a58 = local_3c30;
                args_1 = &local_15a0->name;
                bVar3 = is_npc(in_stack_ffffffffffffc278);
                if (bVar3) {
                  local_3c48 = (CHAR_DATA *)0x7e100f;
                }
                else {
                  local_3c48 = (CHAR_DATA *)local_15a0->pcdata->title;
                }
                local_3a60 = local_3c48;
                bVar3 = is_npc(in_stack_ffffffffffffc278);
                if (bVar3) {
                  local_3c58 = (CHAR_DATA *)0x7e100f;
                }
                else {
                  if (local_15a0->pcdata->extitle == (char *)0x0) {
                    local_3c60 = (CHAR_DATA *)0x7e100f;
                  }
                  else {
                    local_3c60 = (CHAR_DATA *)local_15a0->pcdata->extitle;
                  }
                  local_3c58 = local_3c60;
                }
                local_3a68 = local_3c58;
                local_290 = &stack0xffffffffffffc5c0;
                local_2a0 = local_3a50;
                pDStack_298 = local_3a48;
                local_2a8 = local_39a8;
                local_2b0 = (char (*) [4608])&local_3a58;
                local_2c0 = &local_3a60;
                local_2c8 = &local_3a68;
                local_d0 = &local_2a0;
                local_2d8 = local_3a50;
                local_2d0 = local_3a48;
                local_2b8 = args_1;
                local_c8 = local_2d8;
                pDStack_c0 = local_2d0;
                ::fmt::v9::
                make_format_args<fmt::v9::basic_format_context<fmt::v9::appender,char>,char(&)[4608],char_const*&,char*&,char_const*&,char_const*&>
                          (&local_338,local_2a8,local_2b0,args_1,(char **)local_2c0,
                           (char **)local_2c8,(char **)in_stack_ffffffffffffc278);
                local_b0 = &local_2e8;
                local_b8 = &local_338;
                local_a0 = 0xccccc;
                local_2e8 = 0xccccc;
                fmt.data_._4_1_ = in_stack_ffffffffffffc4f4;
                fmt.data_._0_4_ = in_stack_ffffffffffffc4f0;
                fmt.data_._5_1_ = uVar6;
                fmt.data_._6_1_ = uVar5;
                fmt.data_._7_1_ = uVar4;
                fmt.size_ = (size_t)pCVar10;
                args.desc_._7_1_ = in_stack_ffffffffffffc4e7;
                args.desc_._0_7_ = in_stack_ffffffffffffc4e0;
                args.field_1._0_4_ = uVar9;
                args.field_1._4_4_ = in_stack_ffffffffffffc4ec;
                local_a8 = local_b8;
                local_98 = local_b0;
                local_90 = local_b8;
                local_2e0 = local_b8;
                ::fmt::v9::vformat_abi_cxx11_(fmt,args);
                std::__cxx11::string::operator=(local_1568,(string *)&stack0xffffffffffffc5c0);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffc5c0);
                std::__cxx11::string::data();
                add_buf((BUFFER *)in_stack_ffffffffffffc298,(char *)in_stack_ffffffffffffc290);
              }
            }
          }
        }
      }
    }
    if ((local_157d & 1) == 0) {
      send_to_char((char *)in_stack_ffffffffffffc290,in_stack_ffffffffffffc288);
    }
    else {
      buf_string(local_1570);
      page_to_char((char *)in_stack_ffffffffffffc280,in_stack_ffffffffffffc278);
      free_buf((BUFFER *)0x54e0fd);
    }
    std::__cxx11::string::~string(local_1568);
  }
  return;
}

Assistant:

void do_whois(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Whois who?\n\r", ch);
		return;
	}

	std::string buffer;

	auto output = new_buf();
	auto found = false;
	for (auto d = descriptor_list; d != nullptr; d = d->next)
	{
		char const *class_name;
		char const *imm_lvl;

		if (d->connected != CON_PLAYING || !can_see(ch, d->character))
			continue;

		auto wch = (d->original != nullptr) ? d->original : d->character;

		if (!can_see(ch, wch))
			continue;

		if (is_affected(d->character, gsn_disguise))
			continue;

		if (str_cmp(wch->name, wch->true_name)
			? is_immortal(ch)
				? !str_prefix(arg, wch->true_name) : 0
			: !str_prefix(arg, wch->name))
		{
			found = true;

			/* work out the printing */
			class_name = wch->Class()->who_name;
			switch (wch->level)
			{
				case MAX_LEVEL - 0:
					class_name = "IMP";
					imm_lvl = "Creator";
					break;
				case MAX_LEVEL - 1:
					class_name = "CRE";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 2:
					class_name = "SUP";
					imm_lvl = " Elder ";
					break;
				case MAX_LEVEL - 3:
					class_name = "DEI";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 4:
					class_name = "GOD";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 5:
					class_name = "IMM";
					imm_lvl = "Greater";
					break;
				case MAX_LEVEL - 6:
					class_name = "DEM";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 7:
					class_name = "ANG";
					imm_lvl = " Minor ";
					break;
				case MAX_LEVEL - 8:
					class_name = "AVA";
					imm_lvl = "Avatar ";
					break;
				default:
					imm_lvl = "";
					break;
			}

			char rbuf[MAX_STRING_LENGTH], disp[MAX_STRING_LENGTH];

			/* a little formatting */
			if (is_immortal(ch) || (is_heroimm(wch) && wch->level < 52))
			{
				if (get_trust(ch) >= 52)
					strcpy(rbuf, "  ");
				else
					strcpy(rbuf, "");

				buffer = fmt::sprintf("[%2d %-5s %s%s] %s%s%s%s%s%s%s%s%s%s%s%s\n\r",
					wch->level,
					pc_race_table[wch->race].who_name_five,
					class_name,
					get_trust(ch) >= 52 && wch->pcdata->history_buffer != nullptr ? " *" : rbuf,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					cabal_table[wch->cabal].who_name,
					get_trust(ch) >= 57 && IS_SET(wch->act, PLR_MORON) ? "(MORON) " : "",
					IS_SET(wch->comm, COMM_AFK) && ch->level > 51 ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->true_name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : wch->pcdata->extitle ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
			else if (get_trust(wch) >= 52 && !is_immortal(ch))
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				buffer = fmt::format("{} {}{}{}{}\n\r",
					disp,
					wch->cabal == ch->cabal ? cabal_table[wch->cabal].who_name : "",
					wch->name, 
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : ""); //TODO: change the rest of the sprintf calls to format

				add_buf(output, buffer.data());
			}
			else
			{
				if (wch->pcdata->shifted > -1)
					continue;

				if (is_immortal(wch))
					sprintf(disp, "*   %s  *", imm_lvl);
				else
					sprintf(disp, "[%2d %-5s %s]",
						wch->level,
						pc_race_table[wch->race].who_name_five,
						class_name);

				// TODO: originally had 13 placeholders, but it only has 12 arguments. could be a bug.
				buffer = fmt::format("{} {}{}{}{}{}{}{}{}{}{}{}\n\r",
					disp,
					can_pk(ch, wch) ? "(PK) " : "",
					wch->incog_level >= LEVEL_HERO ? "(Incog) " : "",
					wch->invis_level >= LEVEL_HERO ? "(Wizi) " : "",
					wch->cabal == ch->cabal || is_immortal(wch) ? cabal_table[wch->cabal].who_name : "", "",
					IS_SET(wch->comm, COMM_AFK) ? "[AFK] " : "",
					IS_SET(wch->act, PLR_CRIMINAL) ? "(WANTED) " : "",
					IS_SET(wch->act, PLR_THIEF) ? "(THIEF) " : "",
					isNewbie(wch) ? "(NEWBIE) " : "",
					wch->name,
					is_npc(wch) ? "" : wch->pcdata->title,
					is_npc(wch) ? "" : (wch->pcdata->extitle) ? wch->pcdata->extitle : "");
				add_buf(output, buffer.data());
			}
		}
	}

	if (!found)
	{
		send_to_char("No one of that name is playing.\n\r", ch);
		return;
	}

	page_to_char(buf_string(output), ch);
	free_buf(output);
}